

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLut.c
# Opt level: O2

void Sbl_ManStop(Sbl_Man_t *p)

{
  Hsh_VecMan_t *__ptr;
  Vec_Wec_t *__ptr_00;
  void *__ptr_01;
  Vec_Int_t *__ptr_02;
  long lVar1;
  long lVar2;
  
  sat_solver_delete(p->pSat);
  Vec_IntFree(p->vCardVars);
  Vec_IntFree(p->vLeaves);
  Vec_IntFree(p->vAnds);
  Vec_IntFree(p->vNodes);
  Vec_IntFree(p->vRoots);
  Vec_IntFree(p->vRootVars);
  __ptr = p->pHash;
  Vec_IntFree(__ptr->vTable);
  Vec_IntFree(__ptr->vData);
  Vec_IntFree(__ptr->vMap);
  free(__ptr);
  Vec_IntFree(p->vArrs);
  Vec_IntFree(p->vReqs);
  __ptr_00 = p->vWindow;
  __ptr_02 = __ptr_00->pArray;
  lVar2 = 8;
  for (lVar1 = 0; lVar1 < __ptr_00->nCap; lVar1 = lVar1 + 1) {
    __ptr_01 = *(void **)((long)&__ptr_02->nCap + lVar2);
    if (__ptr_01 != (void *)0x0) {
      free(__ptr_01);
      __ptr_02 = __ptr_00->pArray;
      *(undefined8 *)((long)&__ptr_02->nCap + lVar2) = 0;
    }
    lVar2 = lVar2 + 0x10;
  }
  free(__ptr_02);
  free(__ptr_00);
  Vec_IntFree(p->vPath);
  Vec_IntFree(p->vEdges);
  Vec_WrdFree(p->vCutsI1);
  Vec_WrdFree(p->vCutsI2);
  Vec_WrdFree(p->vCutsN1);
  Vec_WrdFree(p->vCutsN2);
  Vec_IntFree(p->vCutsNum);
  Vec_IntFree(p->vCutsStart);
  Vec_IntFree(p->vCutsObj);
  Vec_IntFree(p->vSolInit);
  Vec_IntFree(p->vSolCur);
  Vec_IntFree(p->vSolBest);
  Vec_WrdFree(p->vTempI1);
  Vec_WrdFree(p->vTempI2);
  Vec_WrdFree(p->vTempN1);
  Vec_WrdFree(p->vTempN2);
  Vec_IntFree(p->vLits);
  Vec_IntFree(p->vAssump);
  Vec_IntFree(p->vPolar);
  free(p);
  return;
}

Assistant:

void Sbl_ManStop( Sbl_Man_t * p )
{
    sat_solver_delete( p->pSat );
    Vec_IntFree( p->vCardVars );
    // internal
    Vec_IntFree( p->vLeaves );
    Vec_IntFree( p->vAnds );
    Vec_IntFree( p->vNodes );
    Vec_IntFree( p->vRoots );
    Vec_IntFree( p->vRootVars );
    Hsh_VecManStop( p->pHash );
    // timing
    Vec_IntFree( p->vArrs );
    Vec_IntFree( p->vReqs );
    Vec_WecFree( p->vWindow );
    Vec_IntFree( p->vPath );
    Vec_IntFree( p->vEdges );
    // cuts
    Vec_WrdFree( p->vCutsI1 );
    Vec_WrdFree( p->vCutsI2 );
    Vec_WrdFree( p->vCutsN1 );
    Vec_WrdFree( p->vCutsN2 );
    Vec_IntFree( p->vCutsNum );
    Vec_IntFree( p->vCutsStart );
    Vec_IntFree( p->vCutsObj );
    Vec_IntFree( p->vSolInit );
    Vec_IntFree( p->vSolCur );
    Vec_IntFree( p->vSolBest );
    Vec_WrdFree( p->vTempI1 );
    Vec_WrdFree( p->vTempI2 );
    Vec_WrdFree( p->vTempN1 );
    Vec_WrdFree( p->vTempN2 );
    // temporary
    Vec_IntFree( p->vLits );
    Vec_IntFree( p->vAssump );
    Vec_IntFree( p->vPolar );
    // other
    ABC_FREE( p );
}